

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking64.h
# Opt level: O3

void packforblock20_64(uint64_t base,uint64_t **pin,uint8_t **pw)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  uint64_t uVar21;
  uint64_t uVar22;
  uint64_t uVar23;
  ulong *puVar24;
  uint64_t uVar25;
  uint64_t uVar26;
  uint64_t uVar27;
  uint64_t uVar28;
  uint64_t uVar29;
  uint64_t uVar30;
  uint64_t uVar31;
  int iVar32;
  
  puVar1 = *pin;
  iVar32 = (int)base;
  uVar2 = puVar1[3];
  uVar3 = puVar1[4];
  uVar25 = puVar1[5];
  uVar4 = puVar1[6];
  uVar5 = puVar1[7];
  uVar26 = puVar1[8];
  uVar6 = puVar1[9];
  uVar7 = puVar1[10];
  uVar8 = puVar1[0xb];
  uVar9 = puVar1[0xc];
  uVar10 = puVar1[0xd];
  uVar11 = puVar1[0xe];
  uVar27 = puVar1[0xf];
  uVar12 = puVar1[0x10];
  uVar13 = puVar1[0x11];
  uVar28 = puVar1[0x12];
  uVar14 = puVar1[0x13];
  uVar15 = puVar1[0x14];
  uVar29 = puVar1[0x15];
  uVar16 = puVar1[0x16];
  uVar17 = puVar1[0x17];
  uVar30 = puVar1[0x18];
  uVar18 = puVar1[0x19];
  uVar19 = puVar1[0x1a];
  uVar20 = puVar1[0x1b];
  uVar21 = puVar1[0x1c];
  uVar22 = puVar1[0x1d];
  uVar23 = puVar1[0x1e];
  uVar31 = puVar1[0x1f];
  puVar24 = (ulong *)*pw;
  *puVar24 = uVar2 - base << 0x3c | (ulong)(uint)((int)puVar1[2] - iVar32) << 0x28 |
             (puVar1[1] - base) * 0x100000 | *puVar1 - base;
  puVar24[1] = uVar4 - base << 0x38 | (ulong)(uint)((int)uVar25 - iVar32) << 0x24 |
               (uVar3 - base) * 0x10000 | uVar2 - base >> 4;
  puVar24[2] = uVar6 - base << 0x34 | (ulong)(uint)((int)uVar26 - iVar32) << 0x20 |
               (uVar5 - base) * 0x1000 | uVar4 - base >> 8;
  puVar24[3] = uVar9 - base << 0x30 | (uVar8 - base) * 0x10000000 |
               (uVar7 - base) * 0x100 | uVar6 - base >> 0xc;
  puVar24[4] = (ulong)(uint)((int)uVar27 - iVar32) << 0x2c | (uVar11 - base) * 0x1000000 |
               (uVar10 - base) * 0x10 | uVar9 - base >> 0x10;
  puVar24[5] = uVar14 - base << 0x3c | (ulong)(uint)((int)uVar28 - iVar32) << 0x28 |
               (uVar13 - base) * 0x100000 | uVar12 - base;
  puVar24[6] = uVar16 - base << 0x38 | (ulong)(uint)((int)uVar29 - iVar32) << 0x24 |
               (uVar15 - base) * 0x10000 | uVar14 - base >> 4;
  puVar24[7] = uVar18 - base << 0x34 | (ulong)(uint)((int)uVar30 - iVar32) << 0x20 |
               (uVar17 - base) * 0x1000 | uVar16 - base >> 8;
  puVar24[8] = uVar21 - base << 0x30 | (uVar20 - base) * 0x10000000 |
               (uVar19 - base) * 0x100 | uVar18 - base >> 0xc;
  puVar24[9] = (ulong)(uint)((int)uVar31 - iVar32) << 0x2c | (uVar23 - base) * 0x1000000 |
               (uVar22 - base) * 0x10 | uVar21 - base >> 0x10;
  *pin = puVar1 + 0x20;
  *pw = *pw + 0x50;
  return;
}

Assistant:

static void packforblock20_64(const uint64_t base, const uint64_t ** pin, uint8_t ** pw) {
  uint64_t * pw64 = *(uint64_t **) pw;
  const uint64_t * in = *pin;
  /* we are going to touch  10 64-bit words */ 
  uint64_t w0;
  uint64_t w1;
  uint64_t w2;
  uint64_t w3;
  uint64_t w4;
  uint64_t w5;
  uint64_t w6;
  uint64_t w7;
  uint64_t w8;
  uint64_t w9;
  w0 = (in[0] - base);
  w0 |=  (in[1] - base) << 20;
  w0 |=  (in[2] - base) << 40;
  w0 |= (in[3] - base) << 60;
  w1 = (in[3] - base) >> 4;
  w1 |=  (in[4] - base) << 16;
  w1 |=  (in[5] - base) << 36;
  w1 |= (in[6] - base) << 56;
  w2 = (in[6] - base) >> 8;
  w2 |=  (in[7] - base) << 12;
  w2 |=  (in[8] - base) << 32;
  w2 |= (in[9] - base) << 52;
  w3 = (in[9] - base) >> 12;
  w3 |=  (in[10] - base) << 8;
  w3 |=  (in[11] - base) << 28;
  w3 |= (in[12] - base) << 48;
  w4 = (in[12] - base) >> 16;
  w4 |=  (in[13] - base) << 4;
  w4 |=  (in[14] - base) << 24;
  w4 |=  (in[15] - base) << 44;
  w5 = (in[16] - base);
  w5 |=  (in[17] - base) << 20;
  w5 |=  (in[18] - base) << 40;
  w5 |= (in[19] - base) << 60;
  w6 = (in[19] - base) >> 4;
  w6 |=  (in[20] - base) << 16;
  w6 |=  (in[21] - base) << 36;
  w6 |= (in[22] - base) << 56;
  w7 = (in[22] - base) >> 8;
  w7 |=  (in[23] - base) << 12;
  w7 |=  (in[24] - base) << 32;
  w7 |= (in[25] - base) << 52;
  w8 = (in[25] - base) >> 12;
  w8 |=  (in[26] - base) << 8;
  w8 |=  (in[27] - base) << 28;
  w8 |= (in[28] - base) << 48;
  w9 = (in[28] - base) >> 16;
  w9 |=  (in[29] - base) << 4;
  w9 |=  (in[30] - base) << 24;
  w9 |=  (in[31] - base) << 44;
  pw64[0] = w0;
  pw64[1] = w1;
  pw64[2] = w2;
  pw64[3] = w3;
  pw64[4] = w4;
  pw64[5] = w5;
  pw64[6] = w6;
  pw64[7] = w7;
  pw64[8] = w8;
  pw64[9] = w9;
  *pin += 32; /* we consumed 32 64-bit integers */ 
  *pw += 80; /* we used up 80 output bytes */ 
}